

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetAccessIds
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MemoryObject *this)

{
  pointer pAVar1;
  uint32_t id;
  ConstantManager *this_00;
  Constant *this_01;
  pointer pAVar2;
  uint32_t *puVar3;
  allocator_type local_29;
  
  this_00 = IRContext::get_constant_mgr(this->variable_inst_->context_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->access_chain_).
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_29);
  pAVar1 = (this->access_chain_).
           super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (pAVar2 = (this->access_chain_).
                super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1) {
    id = (pAVar2->field_1).result_id;
    if (pAVar2->is_result_id == true) {
      this_01 = analysis::ConstantManager::FindDeclaredConstant(this_00,id);
      if (this_01 == (Constant *)0x0) {
        id = 0;
      }
      else {
        id = analysis::Constant::GetU32(this_01);
      }
    }
    *puVar3 = id;
    puVar3 = puVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> CopyPropagateArrays::MemoryObject::GetAccessIds() const {
  analysis::ConstantManager* const_mgr =
      variable_inst_->context()->get_constant_mgr();

  std::vector<uint32_t> indices(AccessChain().size());
  std::transform(AccessChain().cbegin(), AccessChain().cend(), indices.begin(),
                 [&const_mgr](const AccessChainEntry& entry) {
                   if (entry.is_result_id) {
                     const analysis::Constant* constant =
                         const_mgr->FindDeclaredConstant(entry.result_id);
                     return constant == nullptr ? 0 : constant->GetU32();
                   }

                   return entry.immediate;
                 });
  return indices;
}